

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

int mbedtls_net_accept(mbedtls_net_context *bind_ctx,mbedtls_net_context *client_ctx,void *client_ip
                      ,size_t buf_size,size_t *ip_len)

{
  int iVar1;
  ssize_t sVar2;
  int iVar3;
  bool bVar4;
  socklen_t n;
  int type;
  int one;
  socklen_t type_len;
  sockaddr_storage client_addr;
  char buf [1];
  socklen_t local_140;
  int local_13c [3];
  sockaddr local_130;
  undefined8 uStack_120;
  sockaddr local_b0 [8];
  
  local_140 = 0x80;
  local_13c[2] = 4;
  iVar1 = getsockopt(bind_ctx->fd,1,3,local_13c,(socklen_t *)(local_13c + 2));
  if (iVar1 != 0) {
    return -0x4a;
  }
  if (local_13c[0] - 3U < 0xfffffffe) {
    return -0x4a;
  }
  if (local_13c[0] == 1) {
    iVar1 = accept(bind_ctx->fd,&local_130,&local_140);
    client_ctx->fd = iVar1;
  }
  else {
    local_b0[0].sa_family = local_b0[0].sa_family & 0xff00;
    sVar2 = recvfrom(bind_ctx->fd,local_b0,1,2,&local_130,&local_140);
    iVar1 = (int)sVar2;
  }
  if (iVar1 < 0) {
    iVar1 = net_would_block(bind_ctx);
    if (iVar1 != 0) {
      return -0x6900;
    }
    return -0x4a;
  }
  if (local_13c[0] == 1) goto LAB_0012bf70;
  local_13c[1] = 1;
  iVar1 = connect(bind_ctx->fd,&local_130,local_140);
  if (iVar1 == 0) {
    client_ctx->fd = bind_ctx->fd;
    bind_ctx->fd = -1;
    local_140 = 0x80;
    iVar1 = getsockname(client_ctx->fd,local_b0,&local_140);
    iVar3 = -0x42;
    if (iVar1 != 0) goto LAB_0012bf6a;
    iVar1 = socket((uint)local_b0[0].sa_family,2,0x11);
    bind_ctx->fd = iVar1;
    if ((iVar1 < 0) || (iVar1 = setsockopt(iVar1,1,2,local_13c + 1,4), iVar1 != 0))
    goto LAB_0012bf6a;
    iVar1 = bind(bind_ctx->fd,local_b0,local_140);
    bVar4 = iVar1 == 0;
    iVar3 = -0x46;
  }
  else {
    iVar3 = -0x4a;
LAB_0012bf6a:
    bVar4 = false;
  }
  if (!bVar4) {
    return iVar3;
  }
LAB_0012bf70:
  if (client_ip != (void *)0x0) {
    if (local_130.sa_family == 2) {
      *ip_len = 4;
      if (buf_size < 4) {
        return -0x43;
      }
      *(undefined4 *)client_ip = local_130.sa_data._2_4_;
    }
    else {
      *ip_len = 0x10;
      if (buf_size < 0x10) {
        return -0x43;
      }
      *(undefined8 *)client_ip = local_130.sa_data._6_8_;
      *(undefined8 *)((long)client_ip + 8) = uStack_120;
    }
  }
  return 0;
}

Assistant:

int mbedtls_net_accept( mbedtls_net_context *bind_ctx,
                        mbedtls_net_context *client_ctx,
                        void *client_ip, size_t buf_size, size_t *ip_len )
{
    int ret;
    int type;

    struct sockaddr_storage client_addr;

#if defined(__socklen_t_defined) || defined(_SOCKLEN_T) ||  \
    defined(_SOCKLEN_T_DECLARED) || defined(__DEFINED_socklen_t)
    socklen_t n = (socklen_t) sizeof( client_addr );
    socklen_t type_len = (socklen_t) sizeof( type );
#else
    int n = (int) sizeof( client_addr );
    int type_len = (int) sizeof( type );
#endif

    /* Is this a TCP or UDP socket? */
    if( getsockopt( bind_ctx->fd, SOL_SOCKET, SO_TYPE,
                    (void *) &type, &type_len ) != 0 ||
        ( type != SOCK_STREAM && type != SOCK_DGRAM ) )
    {
        return( MBEDTLS_ERR_NET_ACCEPT_FAILED );
    }

    if( type == SOCK_STREAM )
    {
        /* TCP: actual accept() */
        ret = client_ctx->fd = (int) accept( bind_ctx->fd,
                                         (struct sockaddr *) &client_addr, &n );
    }
    else
    {
        /* UDP: wait for a message, but keep it in the queue */
        char buf[1] = { 0 };

        ret = (int) recvfrom( bind_ctx->fd, buf, sizeof( buf ), MSG_PEEK,
                        (struct sockaddr *) &client_addr, &n );

#if defined(_WIN32)
        if( ret == SOCKET_ERROR &&
            WSAGetLastError() == WSAEMSGSIZE )
        {
            /* We know buf is too small, thanks, just peeking here */
            ret = 0;
        }
#endif
    }

    if( ret < 0 )
    {
        if( net_would_block( bind_ctx ) != 0 )
            return( MBEDTLS_ERR_SSL_WANT_READ );

        return( MBEDTLS_ERR_NET_ACCEPT_FAILED );
    }

    /* UDP: hijack the listening socket to communicate with the client,
     * then bind a new socket to accept new connections */
    if( type != SOCK_STREAM )
    {
        struct sockaddr_storage local_addr;
        int one = 1;

        if( connect( bind_ctx->fd, (struct sockaddr *) &client_addr, n ) != 0 )
            return( MBEDTLS_ERR_NET_ACCEPT_FAILED );

        client_ctx->fd = bind_ctx->fd;
        bind_ctx->fd   = -1; /* In case we exit early */

        n = sizeof( struct sockaddr_storage );
        if( getsockname( client_ctx->fd,
                         (struct sockaddr *) &local_addr, &n ) != 0 ||
            ( bind_ctx->fd = (int) socket( local_addr.ss_family,
                                           SOCK_DGRAM, IPPROTO_UDP ) ) < 0 ||
            setsockopt( bind_ctx->fd, SOL_SOCKET, SO_REUSEADDR,
                        (const char *) &one, sizeof( one ) ) != 0 )
        {
            return( MBEDTLS_ERR_NET_SOCKET_FAILED );
        }

        if( bind( bind_ctx->fd, (struct sockaddr *) &local_addr, n ) != 0 )
        {
            return( MBEDTLS_ERR_NET_BIND_FAILED );
        }
    }

    if( client_ip != NULL )
    {
        if( client_addr.ss_family == AF_INET )
        {
            struct sockaddr_in *addr4 = (struct sockaddr_in *) &client_addr;
            *ip_len = sizeof( addr4->sin_addr.s_addr );

            if( buf_size < *ip_len )
                return( MBEDTLS_ERR_NET_BUFFER_TOO_SMALL );

            memcpy( client_ip, &addr4->sin_addr.s_addr, *ip_len );
        }
        else
        {
            struct sockaddr_in6 *addr6 = (struct sockaddr_in6 *) &client_addr;
            *ip_len = sizeof( addr6->sin6_addr.s6_addr );

            if( buf_size < *ip_len )
                return( MBEDTLS_ERR_NET_BUFFER_TOO_SMALL );

            memcpy( client_ip, &addr6->sin6_addr.s6_addr, *ip_len);
        }
    }

    return( 0 );
}